

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

void cp_decl_attributes(CPState *cp,CPDecl *decl)

{
  GCstr *pGVar1;
  TValue *pTVar2;
  uint uVar3;
  int iVar4;
  CTSize CVar5;
  GCstr *pGVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  bool bVar10;
  
LAB_001543e0:
  do {
    switch(cp->tok) {
    case 0x118:
      uVar3 = decl->attr;
      uVar7 = 0x2000000;
      break;
    case 0x119:
      uVar3 = decl->attr;
      uVar7 = 0x1000000;
      break;
    case 0x11a:
    case 0x121:
    case 0x125:
      goto switchD_001543f6_caseD_11a;
    default:
      return;
    case 0x122:
      cp_next(cp);
      cp_check(cp,0x28);
      if (cp->tok == 0x101) {
        pGVar6 = cp->str;
        iVar4 = cp_next(cp);
        while (iVar4 == 0x101) {
          lj_strfmt_pushf(cp->L,"%s%s",pGVar6 + 1,cp->str + 1);
          pTVar2 = cp->L->top;
          cp->L->top = pTVar2 + -1;
          pGVar6 = (GCstr *)(ulong)pTVar2[-1].u32.lo;
          iVar4 = cp_next(cp);
        }
        decl->redir = pGVar6;
      }
      goto LAB_001547c9;
    case 0x123:
      cp_next(cp);
      cp_check(cp,0x28);
      cp_check(cp,0x28);
      do {
        iVar4 = cp->tok;
        if (iVar4 == 0x100) {
          pGVar6 = cp->str;
          uVar3 = pGVar6->len;
          if (((((0xc < uVar3) && ((char)pGVar6[1].nextgc.gcptr32 == '_')) &&
               (*(char *)((long)&pGVar6[1].nextgc.gcptr32 + 1) == '_')) &&
              ((*(char *)((long)&pGVar6[1].nextgc.gcptr32 + 2) != '_' &&
               (*(char *)((long)&pGVar6[1].nextgc.gcptr32 + (ulong)(uVar3 - 2)) == '_')))) &&
             (*(char *)((long)&pGVar6[1].nextgc.gcptr32 + (ulong)(uVar3 - 1)) == '_')) {
            pGVar6 = lj_str_new(cp->L,(char *)((long)&pGVar6[1].nextgc.gcptr32 + 2),
                                (ulong)(uVar3 - 4));
          }
          cp_next(cp);
          iVar4 = lj_cparse_case(pGVar6,
                                 "\aaligned\v__aligned__\x06packed\n__packed__\x04mode\b__mode__\vvector_size\x0f__vector_size__"
                                );
          switch(iVar4) {
          case 0:
          case 1:
            cp_decl_align(cp,decl);
            break;
          case 2:
          case 3:
            *(byte *)&decl->attr = (byte)decl->attr | 2;
            break;
          case 4:
          case 5:
            cp_check(cp,0x28);
            if (cp->tok != 0x100) goto LAB_0015467a;
            pGVar1 = cp->str;
            pGVar6 = pGVar1 + 1;
            cVar8 = (char)pGVar1[1].nextgc.gcptr32;
            if (cVar8 == '_') {
              bVar10 = *(char *)((long)&pGVar1[1].nextgc.gcptr32 + 1) == '_';
              if (bVar10) {
                pGVar6 = (GCstr *)((long)&pGVar1[1].nextgc.gcptr32 + 2);
              }
              cVar8 = *(char *)((long)&pGVar1[1].nextgc.gcptr32 + (ulong)bVar10 * 2);
            }
            iVar4 = 0;
            if (cVar8 == 'V') {
              iVar4 = *(char *)((long)&(pGVar6->nextgc).gcptr32 + 1) + -0x30;
              cVar8 = *(char *)((long)&(pGVar6->nextgc).gcptr32 + 2);
              if ((byte)(cVar8 - 0x30U) < 10) {
                iVar4 = (uint)(byte)(cVar8 - 0x30U) + iVar4 * 10;
                cVar8 = *(char *)((long)&(pGVar6->nextgc).gcptr32 + 3);
                pGVar6 = (GCstr *)((long)&(pGVar6->nextgc).gcptr32 + 3);
              }
              else {
                pGVar6 = (GCstr *)((long)&(pGVar6->nextgc).gcptr32 + 2);
              }
            }
            switch(cVar8) {
            case 'O':
              iVar9 = 0x20;
              break;
            case 'P':
            case 'R':
              goto switchD_001545fa_caseD_50;
            case 'Q':
              iVar9 = 1;
              break;
            case 'S':
              iVar9 = 4;
              break;
            case 'T':
              iVar9 = 0x10;
              break;
            default:
              if (cVar8 == 'D') {
                iVar9 = 8;
              }
              else {
                if (cVar8 != 'H') goto switchD_001545fa_caseD_50;
                iVar9 = 2;
              }
            }
            cVar8 = *(char *)((long)&(pGVar6->nextgc).gcptr32 + 1);
            if ((cVar8 == 'I') || (cVar8 == 'F')) {
              uVar3 = decl->attr;
              decl->attr = iVar9 << 8 | uVar3 & 0xffff00ff;
              if (iVar4 != 0) {
                uVar7 = 0x1f;
                if (iVar9 * iVar4 != 0) {
                  for (; (uint)(iVar9 * iVar4) >> uVar7 == 0; uVar7 = uVar7 - 1) {
                  }
                }
                decl->attr = ((~uVar7 & 0xf) << 4 | iVar9 << 8 | uVar3 & 0xffff000f) ^ 0xf0;
              }
            }
switchD_001545fa_caseD_50:
            cp_next(cp);
            goto LAB_0015467a;
          case 6:
          case 7:
            CVar5 = cp_decl_sizeattr(cp);
            if (CVar5 != 0) {
              uVar3 = 0x1f;
              if (CVar5 != 0) {
                for (; CVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              decl->attr = ((~uVar3 & 0xf) << 4 | decl->attr & 0xffffff0f) ^ 0xf0;
            }
            break;
          default:
            goto switchD_00154520_default;
          }
LAB_00154687:
          iVar4 = cp->tok;
        }
        else {
          if ((iVar4 == 0x29) || (iVar4 < 0x10d)) goto LAB_0015469d;
          cp_next(cp);
switchD_00154520_default:
          iVar4 = cp->tok;
          if (iVar4 == 0x28) {
            do {
              cp_next(cp);
              if (cp->tok == 0x103) break;
            } while (cp->tok != 0x29);
LAB_0015467a:
            cp_check(cp,0x29);
            goto LAB_00154687;
          }
        }
        if (iVar4 != 0x2c) goto LAB_0015469d;
        cp_next(cp);
      } while( true );
    case 0x124:
      cp_next(cp);
      cp_check(cp,0x28);
      iVar4 = cp->tok;
joined_r0x00154757:
      if (iVar4 == 0x100) {
        pGVar6 = cp->str;
        cp_next(cp);
        if ((pGVar6->len != 5) ||
           (pGVar6[1].marked != 'n' || pGVar6[1].nextgc.gcptr32 != 0x67696c61)) goto LAB_00154783;
        cp_decl_align(cp,decl);
        goto LAB_001547be;
      }
      goto LAB_001547c9;
    case 0x126:
      uVar7 = decl->attr & 0xffff00ff;
      uVar3 = (cp->ct->size & 0xff) << 8;
    }
    decl->attr = uVar3 | uVar7;
switchD_001543f6_caseD_11a:
    cp_next(cp);
  } while( true );
LAB_00154783:
  iVar4 = cp->tok;
  if (iVar4 == 0x28) {
    do {
      cp_next(cp);
      if (cp->tok == 0x103) break;
    } while (cp->tok != 0x29);
    cp_check(cp,0x29);
LAB_001547be:
    iVar4 = cp->tok;
  }
  goto joined_r0x00154757;
LAB_0015469d:
  cp_check(cp,0x29);
LAB_001547c9:
  cp_check(cp,0x29);
  goto LAB_001543e0;
}

Assistant:

static void cp_decl_attributes(CPState *cp, CPDecl *decl)
{
  for (;;) {
    switch (cp->tok) {
    case CTOK_CONST: decl->attr |= CTF_CONST; break;
    case CTOK_VOLATILE: decl->attr |= CTF_VOLATILE; break;
    case CTOK_RESTRICT: break;  /* Ignore. */
    case CTOK_EXTENSION: break;  /* Ignore. */
    case CTOK_ATTRIBUTE: cp_decl_gccattribute(cp, decl); continue;
    case CTOK_ASM: cp_decl_asm(cp, decl); continue;
    case CTOK_DECLSPEC: cp_decl_msvcattribute(cp, decl); continue;
    case CTOK_CCDECL:
#if LJ_TARGET_X86
      CTF_INSERT(decl->fattr, CCONV, cp->ct->size);
      decl->fattr |= CTFP_CCONV;
#endif
      break;
    case CTOK_PTRSZ:
#if LJ_64
      CTF_INSERT(decl->attr, MSIZEP, cp->ct->size);
#endif
      break;
    default: return;
    }
    cp_next(cp);
  }
}